

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

RuleBasedCollator * __thiscall
icu_63::RuleBasedNumberFormat::getCollator(RuleBasedNumberFormat *this)

{
  short sVar1;
  _func_int **pp_Var2;
  Collator *pCVar3;
  RuleBasedCollator *pRVar4;
  UnicodeString *pUVar5;
  int32_t srcLength;
  UErrorCode status;
  UnicodeString rules;
  UErrorCode local_5c;
  UnicodeString local_58;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
LAB_0021fc0f:
    pRVar4 = (RuleBasedCollator *)0x0;
  }
  else {
    if ((this->collator == (RuleBasedCollator *)0x0) && (this->lenient != '\0')) {
      local_5c = U_ZERO_ERROR;
      pCVar3 = Collator::createInstance(&this->locale,&local_5c);
      if (local_5c < U_ILLEGAL_ARGUMENT_ERROR) {
        if (pCVar3 == (Collator *)0x0) {
          pRVar4 = (RuleBasedCollator *)0x0;
        }
        else {
          pRVar4 = (RuleBasedCollator *)
                   __dynamic_cast(pCVar3,&Collator::typeinfo,&RuleBasedCollator::typeinfo,0);
        }
        if (pRVar4 != (RuleBasedCollator *)0x0) {
          if (this->lenientParseRules == (UnicodeString *)0x0) {
            pCVar3 = (Collator *)0x0;
          }
          else {
            pUVar5 = RuleBasedCollator::getRules(pRVar4);
            UnicodeString::UnicodeString(&local_58,pUVar5);
            pUVar5 = this->lenientParseRules;
            sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              srcLength = (pUVar5->fUnion).fFields.fLength;
            }
            else {
              srcLength = (int)sVar1 >> 5;
            }
            UnicodeString::doAppend(&local_58,pUVar5,0,srcLength);
            pRVar4 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)pUVar5);
            if (pRVar4 == (RuleBasedCollator *)0x0) {
              pRVar4 = (RuleBasedCollator *)0x0;
            }
            else {
              RuleBasedCollator::RuleBasedCollator(pRVar4,&local_58,&local_5c);
            }
            UnicodeString::~UnicodeString(&local_58);
            if (pRVar4 == (RuleBasedCollator *)0x0) goto LAB_0021fc0f;
          }
          pp_Var2 = (pRVar4->super_Collator).super_UObject._vptr_UObject;
          if (local_5c < U_ILLEGAL_ARGUMENT_ERROR) {
            (*pp_Var2[0x17])(pRVar4,4,0x11,&local_5c);
            this->collator = pRVar4;
          }
          else {
            (*pp_Var2[1])(pRVar4);
          }
        }
      }
      if (pCVar3 != (Collator *)0x0) {
        (*(pCVar3->super_UObject)._vptr_UObject[1])(pCVar3);
      }
    }
    pRVar4 = this->collator;
  }
  return pRVar4;
}

Assistant:

const RuleBasedCollator*
RuleBasedNumberFormat::getCollator() const
{
#if !UCONFIG_NO_COLLATION
    if (!fRuleSets) {
        return NULL;
    }

    // lazy-evaluate the collator
    if (collator == NULL && lenient) {
        // create a default collator based on the formatter's locale,
        // then pull out that collator's rules, append any additional
        // rules specified in the description, and create a _new_
        // collator based on the combination of those rules

        UErrorCode status = U_ZERO_ERROR;

        Collator* temp = Collator::createInstance(locale, status);
        RuleBasedCollator* newCollator;
        if (U_SUCCESS(status) && (newCollator = dynamic_cast<RuleBasedCollator*>(temp)) != NULL) {
            if (lenientParseRules) {
                UnicodeString rules(newCollator->getRules());
                rules.append(*lenientParseRules);

                newCollator = new RuleBasedCollator(rules, status);
                // Exit if newCollator could not be created.
                if (newCollator == NULL) {
                    return NULL;
                }
            } else {
                temp = NULL;
            }
            if (U_SUCCESS(status)) {
                newCollator->setAttribute(UCOL_DECOMPOSITION_MODE, UCOL_ON, status);
                // cast away const
                ((RuleBasedNumberFormat*)this)->collator = newCollator;
            } else {
                delete newCollator;
            }
        }
        delete temp;
    }
#endif

    // if lenient-parse mode is off, this will be null
    // (see setLenientParseMode())
    return collator;
}